

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transport2.c
# Opt level: O1

void ssh2_mkkey(ssh2_transport_state *s,strbuf *out,strbuf *kex_shared_secret,uchar *H,char chr,
               int keylen)

{
  ssh_hashalg *psVar1;
  int iVar2;
  ptrlen pl;
  ptrlen pl_00;
  uchar *data;
  ssh_hash *psVar3;
  long *plVar4;
  size_t len;
  long lVar5;
  long lVar6;
  int iVar7;
  uchar *puVar8;
  
  if (keylen != 0) {
    iVar2 = (int)s->kex_alg->hash->hlen;
    iVar7 = keylen + -1 + iVar2;
    iVar7 = iVar7 - iVar7 % iVar2;
    strbuf_shrink_to(out,0);
    data = (uchar *)strbuf_append(out,(long)iVar7);
    psVar1 = s->kex_alg->hash;
    psVar3 = (*psVar1->new)(psVar1);
    if (psVar3 != (ssh_hash *)0x0) {
      (*psVar3->vt->reset)(psVar3);
    }
    if (((s->ppl).remote_bugs & 0x20) == 0) {
      pl.ptr = kex_shared_secret->u;
      pl.len = kex_shared_secret->len;
      BinarySink_put_datapl(psVar3->binarysink_,pl);
    }
    len = (size_t)iVar2;
    BinarySink_put_data(psVar3->binarysink_,H,len);
    BinarySink_put_byte(psVar3->binarysink_,chr);
    BinarySink_put_data(psVar3->binarysink_,s->session_id,(long)s->session_id_len);
    (*psVar3->vt->digest)(psVar3,data);
    if (iVar2 < iVar7) {
      (*psVar3->vt->reset)(psVar3);
      if (((s->ppl).remote_bugs & 0x20) == 0) {
        pl_00.ptr = kex_shared_secret->u;
        pl_00.len = kex_shared_secret->len;
        BinarySink_put_datapl(psVar3->binarysink_,pl_00);
      }
      BinarySink_put_data(psVar3->binarysink_,H,len);
      if (iVar2 < iVar7) {
        lVar5 = (long)iVar2;
        lVar6 = lVar5;
        puVar8 = data;
        do {
          puVar8 = puVar8 + lVar5;
          BinarySink_put_data(psVar3->binarysink_,data,len);
          plVar4 = (long *)(*psVar3->vt->new)();
          (**(code **)(*plVar4 + 0x10))(plVar4,psVar3);
          (**(code **)(*plVar4 + 0x18))(plVar4,puVar8);
          (**(code **)(*plVar4 + 0x20))(plVar4);
          lVar6 = lVar6 + lVar5;
          data = data + lVar5;
        } while (lVar6 < iVar7);
      }
    }
    (*psVar3->vt->free)(psVar3);
    return;
  }
  return;
}

Assistant:

static void ssh2_mkkey(
    struct ssh2_transport_state *s, strbuf *out,
    strbuf *kex_shared_secret, unsigned char *H, char chr, int keylen)
{
    int hlen = s->kex_alg->hash->hlen;
    int keylen_padded;
    unsigned char *key;
    ssh_hash *h;

    if (keylen == 0)
        return;

    /*
     * Round the requested amount of key material up to a multiple of
     * the length of the hash we're using to make it. This makes life
     * simpler because then we can just write each hash output block
     * straight into the output buffer without fiddling about
     * truncating the last one. Since it's going into a strbuf, and
     * strbufs are always smemclr()ed on free, there's no need to
     * worry about leaving extra potentially-sensitive data in memory
     * that the caller didn't ask for.
     */
    keylen_padded = ((keylen + hlen - 1) / hlen) * hlen;

    strbuf_clear(out);
    key = strbuf_append(out, keylen_padded);

    /* First hlen bytes. */
    h = ssh_hash_new(s->kex_alg->hash);
    if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
        put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
    put_data(h, H, hlen);
    put_byte(h, chr);
    put_data(h, s->session_id, s->session_id_len);
    ssh_hash_digest(h, key);

    /* Subsequent blocks of hlen bytes. */
    if (keylen_padded > hlen) {
        int offset;

        ssh_hash_reset(h);
        if (!(s->ppl.remote_bugs & BUG_SSH2_DERIVEKEY))
            put_datapl(h, ptrlen_from_strbuf(kex_shared_secret));
        put_data(h, H, hlen);

        for (offset = hlen; offset < keylen_padded; offset += hlen) {
            put_data(h, key + offset - hlen, hlen);
            ssh_hash_digest_nondestructive(h, key + offset);
        }

    }

    ssh_hash_free(h);
}